

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O0

ConvertMnemonicToSeedResponseStruct *
cfd::js::api::HDWalletStructApi::ConvertMnemonicToSeed
          (ConvertMnemonicToSeedResponseStruct *__return_storage_ptr__,
          ConvertMnemonicToSeedRequestStruct *request)

{
  ConvertMnemonicToSeedRequestStruct *this;
  string *in_R8;
  allocator local_149;
  function<cfd::js::api::ConvertMnemonicToSeedResponseStruct_(const_cfd::js::api::ConvertMnemonicToSeedRequestStruct_&)>
  local_148;
  undefined1 local_128 [270];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  ConvertMnemonicToSeedRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  ConvertMnemonicToSeedRequestStruct *request_local;
  ConvertMnemonicToSeedResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  ConvertMnemonicToSeedResponseStruct::ConvertMnemonicToSeedResponseStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::ConvertMnemonicToSeedResponseStruct(cfd::js::api::ConvertMnemonicToSeedRequestStruct_const&)>
  ::
  function<cfd::js::api::HDWalletStructApi::ConvertMnemonicToSeed(cfd::js::api::ConvertMnemonicToSeedRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::ConvertMnemonicToSeedResponseStruct(cfd::js::api::ConvertMnemonicToSeedRequestStruct_const&)>
              *)local_128,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"ConvertMnemonicToSeed",&local_149);
  ExecuteStructApi<cfd::js::api::ConvertMnemonicToSeedRequestStruct,cfd::js::api::ConvertMnemonicToSeedResponseStruct>
            ((ConvertMnemonicToSeedResponseStruct *)(local_128 + 0x20),(api *)this,
             (ConvertMnemonicToSeedRequestStruct *)local_128,&local_148,in_R8);
  ConvertMnemonicToSeedResponseStruct::operator=
            (__return_storage_ptr__,(ConvertMnemonicToSeedResponseStruct *)(local_128 + 0x20));
  ConvertMnemonicToSeedResponseStruct::~ConvertMnemonicToSeedResponseStruct
            ((ConvertMnemonicToSeedResponseStruct *)(local_128 + 0x20));
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::
  function<cfd::js::api::ConvertMnemonicToSeedResponseStruct_(const_cfd::js::api::ConvertMnemonicToSeedRequestStruct_&)>
  ::~function((function<cfd::js::api::ConvertMnemonicToSeedResponseStruct_(const_cfd::js::api::ConvertMnemonicToSeedRequestStruct_&)>
               *)local_128);
  return __return_storage_ptr__;
}

Assistant:

ConvertMnemonicToSeedResponseStruct HDWalletStructApi::ConvertMnemonicToSeed(
    const ConvertMnemonicToSeedRequestStruct& request) {
  auto call_func = [](const ConvertMnemonicToSeedRequestStruct& request)
      -> ConvertMnemonicToSeedResponseStruct {
    ConvertMnemonicToSeedResponseStruct response;
    // check language is support
    std::vector<std::string> mnemonic = request.mnemonic;
    std::string passphrase = request.passphrase;
    bool strict_check = request.strict_check;
    std::string language = request.language;
    bool use_ideographic_space =
        ((language == "jp") && request.use_ideographic_space);
    ByteData entropy;

    // get bip39 wordlist
    HDWalletApi api;
    ByteData seed = api.ConvertMnemonicToSeed(
        mnemonic, passphrase, strict_check, language, use_ideographic_space,
        &entropy);
    if (entropy.Empty()) {
      response.ignore_items.insert("entropy");
    } else {
      response.entropy = entropy.GetHex();
    }

    response.seed = seed.GetHex();
    return response;
  };

  ConvertMnemonicToSeedResponseStruct result;
  result = ExecuteStructApi<
      ConvertMnemonicToSeedRequestStruct, ConvertMnemonicToSeedResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}